

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_to_uint32_array(roaring_array_t *ra,uint32_t *ans)

{
  int iVar1;
  int local_24;
  int num_added;
  int32_t i;
  size_t ctr;
  uint32_t *ans_local;
  roaring_array_t *ra_local;
  
  _num_added = 0;
  for (local_24 = 0; local_24 < ra->size; local_24 = local_24 + 1) {
    iVar1 = container_to_uint32_array
                      (ans + _num_added,ra->containers[local_24],ra->typecodes[local_24],
                       (uint)ra->keys[local_24] << 0x10);
    _num_added = iVar1 + _num_added;
  }
  return;
}

Assistant:

void ra_to_uint32_array(const roaring_array_t *ra, uint32_t *ans) {
    size_t ctr = 0;
    for (int32_t i = 0; i < ra->size; ++i) {
        int num_added = container_to_uint32_array(
            ans + ctr, ra->containers[i], ra->typecodes[i],
            ((uint32_t)ra->keys[i]) << 16);
        ctr += num_added;
    }
}